

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O1

int sjtu::timeType::dateminus(timeType *lhs,timeType *rhs)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = 0;
  iVar2 = 0;
  if (1 < (long)lhs->month) {
    iVar2 = 0;
    lVar3 = 1;
    do {
      iVar2 = iVar2 + *(int *)(months + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lhs->month != lVar3);
  }
  if (1 < (long)rhs->month) {
    iVar1 = 0;
    lVar3 = 1;
    do {
      iVar1 = iVar1 + *(int *)(months + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (rhs->month != lVar3);
  }
  return (lhs->day + iVar2) - (iVar1 + rhs->day);
}

Assistant:

int timeType::dateminus(const timeType &lhs, const timeType &rhs) {
            int tmp1 = 0, tmp2 = 0;
            for (int i = 1; i < lhs.month; ++i)
                tmp1 += lhs.months[i];
            tmp1 += lhs.day;
            for (int i = 1; i < rhs.month; ++i)
                tmp2 += rhs.months[i];
            tmp2 += rhs.day;
            return (tmp1 - tmp2);
        }